

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::type_to_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,uint32_t id)

{
  bool bVar1;
  uint32_t uVar2;
  bool *pbVar3;
  spirv_cross *this_00;
  char (*ts) [3];
  size_type sVar4;
  char *pcVar5;
  CompilerError *pCVar6;
  SPIRConstant *this_01;
  ulong uVar7;
  SPIRType *pSVar8;
  char (*ts_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1_00;
  char (*in_R8) [2];
  uint *in_R9;
  char (*in_stack_fffffffffffffbc8) [2];
  allocator *paVar9;
  bool local_309;
  allocator local_269;
  allocator local_268;
  allocator local_267;
  allocator local_266;
  allocator local_265;
  allocator local_264;
  allocator local_263;
  allocator local_262;
  allocator local_261;
  allocator local_260;
  allocator local_25f;
  allocator local_25e;
  allocator local_25d;
  allocator local_25c;
  allocator local_25b;
  allocator local_25a;
  allocator local_259;
  string local_258;
  string local_238;
  string local_218 [32];
  string local_1f8;
  allocator local_1d1;
  string local_1d0;
  SPIRConstant *local_1b0;
  SPIRConstant *scope;
  string scope_expr;
  char *use;
  uint32_t use_type;
  SPIRType *local_158;
  SPIRType *coop_type;
  string local_148;
  allocator local_121;
  string local_120;
  allocator local_fd;
  allocator local_fc;
  allocator local_fb;
  allocator local_fa;
  allocator local_f9;
  string local_f8 [36];
  ID local_d4;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  ID local_3c;
  uint32_t local_38;
  undefined1 local_31;
  uint32_t array_stride;
  SPIRType *parent;
  SPIRType *pSStack_20;
  uint32_t id_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  string *name;
  
  parent._4_4_ = id;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerGLSL *)__return_storage_ptr__;
  bVar1 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if ((!bVar1) ||
     (bVar1 = Compiler::is_physical_pointer_to_buffer_block(&this->super_Compiler,pSStack_20), bVar1
     )) {
    switch(pSStack_20->basetype) {
    case Void:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_fc);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fc);
      break;
    default:
      if ((pSStack_20->basetype == UInt) && (bVar1 = is_legacy(this), bVar1)) {
        if (((this->options).es & 1U) != 0) {
          pcVar5 = (this->backend).basic_int_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_fd);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_fd);
          return __return_storage_ptr__;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_120,"GL_EXT_gpu_shader4",&local_121);
        require_extension_internal(this,&local_120);
        ::std::__cxx11::string::~string((string *)&local_120);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_121);
      }
      if (pSStack_20->basetype == AtomicCounter) {
        if ((((this->options).es & 1U) != 0) && ((this->options).version < 0x136)) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar6,"At least ESSL 3.10 required for atomic counters.");
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if ((((this->options).es & 1U) == 0) && ((this->options).version < 0x1a4)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_148,"GL_ARB_shader_atomic_counters",
                     (allocator *)((long)&coop_type + 7));
          require_extension_internal(this,&local_148);
          ::std::__cxx11::string::~string((string *)&local_148);
          ::std::allocator<char>::~allocator((allocator<char> *)((long)&coop_type + 7));
        }
      }
      local_158 = pSStack_20;
      while( true ) {
        bVar1 = Compiler::is_pointer(&this->super_Compiler,local_158);
        local_309 = true;
        if (!bVar1) {
          local_309 = Compiler::is_array(&this->super_Compiler,local_158);
        }
        if (local_309 == false) break;
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_158->parent_type);
        local_158 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
      }
      if (*(int *)&(local_158->super_IVariant).field_0xc == 0x1168) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&use_type,"GL_KHR_cooperative_matrix",(allocator *)((long)&use + 7));
        require_extension_internal(this,(string *)&use_type);
        ::std::__cxx11::string::~string((string *)&use_type);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&use + 7));
        if (((this->options).vulkan_semantics & 1U) == 0) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar6,"Cooperative matrix only available in Vulkan.");
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        this_01 = Compiler::get<spirv_cross::SPIRConstant>
                            (&this->super_Compiler,(local_158->cooperative).use_id);
        use._0_4_ = SPIRConstant::scalar(this_01,0,0);
        scope_expr.field_2._8_8_ = 0;
        if ((uint32_t)use == 0) {
          scope_expr.field_2._8_8_ = anon_var_dwarf_65de30;
        }
        else if ((uint32_t)use == 1) {
          scope_expr.field_2._8_8_ = anon_var_dwarf_65de3c;
        }
        else {
          if ((uint32_t)use != 2) {
            pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
            CompilerError::CompilerError(pCVar6,"Invalid matrix use.");
            __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
          }
          scope_expr.field_2._8_8_ = anon_var_dwarf_65de48;
        }
        ::std::__cxx11::string::string((string *)&scope);
        local_1b0 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                              (&this->super_Compiler,(local_158->cooperative).scope_id);
        if ((local_1b0 != (SPIRConstant *)0x0) && ((local_1b0->specialization & 1U) == 0)) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    ((string *)&local_1d0,"GL_KHR_memory_scope_semantics",&local_1d1);
          require_extension_internal(this,&local_1d0);
          ::std::__cxx11::string::~string((string *)&local_1d0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
          uVar2 = SPIRConstant::scalar(local_1b0,0,0);
          if (uVar2 == 3) {
            ::std::__cxx11::string::operator=((string *)&scope,"gl_ScopeSubgroup");
          }
          else {
            uVar2 = SPIRConstant::scalar(local_1b0,0,0);
            if (uVar2 != 2) {
              pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
              CompilerError::CompilerError(pCVar6,"Invalid scope for cooperative matrix.");
              __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
            }
            ::std::__cxx11::string::operator=((string *)&scope,"gl_ScopeWorkgroup");
          }
        }
        uVar7 = ::std::__cxx11::string::empty();
        if ((uVar7 & 1) != 0) {
          to_expression_abi_cxx11_(&local_1f8,this,(local_158->cooperative).scope_id,true);
          ::std::__cxx11::string::operator=((string *)&scope,(string *)&local_1f8);
          ::std::__cxx11::string::~string((string *)&local_1f8);
        }
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_158->parent_type);
        pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
        (*(this->super_Compiler)._vptr_Compiler[0x13])(local_218,this,pSVar8,0);
        to_expression_abi_cxx11_(&local_238,this,(local_158->cooperative).rows_id,true);
        to_expression_abi_cxx11_(&local_258,this,(local_158->cooperative).columns_id,true);
        join<char_const(&)[9],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],char_const*&,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)"coopmat<",(char (*) [9])local_218,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                   (char (*) [3])&scope,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                   (char (*) [3])&local_238,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                   (char (*) [3])&local_258,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                   (char (*) [3])((long)&scope_expr.field_2 + 8),(char **)0x5a981b,
                   in_stack_fffffffffffffbc8);
        ::std::__cxx11::string::~string((string *)&local_258);
        ::std::__cxx11::string::~string((string *)&local_238);
        ::std::__cxx11::string::~string(local_218);
        ::std::__cxx11::string::~string((string *)&scope);
      }
      else if ((pSStack_20->vecsize == 1) && (pSStack_20->columns == 1)) {
        switch(pSStack_20->basetype) {
        case Boolean:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_259);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_259);
          break;
        case SByte:
          pcVar5 = (this->backend).basic_int8_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25a);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25a);
          break;
        case UByte:
          pcVar5 = (this->backend).basic_uint8_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25b);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25b);
          break;
        case Short:
          pcVar5 = (this->backend).basic_int16_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25c);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25c);
          break;
        case UShort:
          pcVar5 = (this->backend).basic_uint16_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25d);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25d);
          break;
        case Int:
          pcVar5 = (this->backend).basic_int_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25e);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25e);
          break;
        case UInt:
          pcVar5 = (this->backend).basic_uint_type;
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_25f);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_25f);
          break;
        case Int64:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"int64_t",&local_264);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_264);
          break;
        case UInt64:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"uint64_t",&local_265);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_265);
          break;
        case AtomicCounter:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"atomic_uint",&local_260);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_260);
          break;
        case Half:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"float16_t",&local_261);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_261);
          break;
        case Float:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"float",&local_262);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_262);
          break;
        case Double:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_263);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_263);
          break;
        default:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_266);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_266);
        }
      }
      else if ((pSStack_20->vecsize < 2) || (pSStack_20->columns != 1)) {
        if (pSStack_20->vecsize == pSStack_20->columns) {
          switch(pSStack_20->basetype) {
          case Boolean:
            join<char_const(&)[5],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"bmat",
                       (char (*) [5])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
            break;
          default:
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_268);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_268);
            break;
          case Int:
            join<char_const(&)[5],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"imat",
                       (char (*) [5])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
            break;
          case UInt:
            join<char_const(&)[5],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"umat",
                       (char (*) [5])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
            break;
          case Half:
            join<char_const(&)[7],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"f16mat",
                       (char (*) [7])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
            break;
          case Float:
            join<char_const(&)[4],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)0x5b7bee,
                       (char (*) [4])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
            break;
          case Double:
            join<char_const(&)[5],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"dmat",
                       (char (*) [5])&pSStack_20->vecsize,&switchD_004b9c73::switchdataD_005adcf4);
          }
        }
        else {
          switch(pSStack_20->basetype) {
          case Boolean:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"bmat",
                       (char (*) [5])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
            break;
          default:
            paVar9 = &local_269;
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",paVar9);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_269);
            break;
          case Int:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"imat",
                       (char (*) [5])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
            break;
          case UInt:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"umat",
                       (char (*) [5])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
            break;
          case Half:
            join<char_const(&)[7],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"f16mat",
                       (char (*) [7])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
            break;
          case Float:
            join<char_const(&)[4],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)0x5b7bee,
                       (char (*) [4])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
            break;
          case Double:
            join<char_const(&)[5],unsigned_int_const&,char_const(&)[2],unsigned_int_const&>
                      (__return_storage_ptr__,(spirv_cross *)"dmat",
                       (char (*) [5])&pSStack_20->columns,(uint *)0x5abb75,
                       (char (*) [2])&pSStack_20->vecsize,in_R9);
          }
        }
      }
      else {
        switch(pSStack_20->basetype) {
        case Boolean:
          join<char_const(&)[5],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"bvec",(char (*) [5])&pSStack_20->vecsize
                     ,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case SByte:
          join<char_const(&)[6],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"i8vec",
                     (char (*) [6])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case UByte:
          join<char_const(&)[6],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"u8vec",
                     (char (*) [6])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case Short:
          join<char_const(&)[7],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"i16vec",
                     (char (*) [7])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case UShort:
          join<char_const(&)[7],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"u16vec",
                     (char (*) [7])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case Int:
          join<char_const(&)[5],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"ivec",(char (*) [5])&pSStack_20->vecsize
                     ,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case UInt:
          join<char_const(&)[5],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"uvec",(char (*) [5])&pSStack_20->vecsize
                     ,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case Int64:
          join<char_const(&)[7],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"i64vec",
                     (char (*) [7])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case UInt64:
          join<char_const(&)[7],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"u64vec",
                     (char (*) [7])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        default:
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"???",&local_267);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_267);
          break;
        case Half:
          join<char_const(&)[7],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"f16vec",
                     (char (*) [7])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case Float:
          join<char_const(&)[4],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)0x595290,
                     (char (*) [4])&pSStack_20->vecsize,&switchD_004b9a4f::switchdataD_005add28);
          break;
        case Double:
          join<char_const(&)[5],unsigned_int_const&>
                    (__return_storage_ptr__,(spirv_cross *)"dvec",(char (*) [5])&pSStack_20->vecsize
                     ,&switchD_004b9a4f::switchdataD_005add28);
        }
      }
      break;
    case Struct:
      if (((this->backend).explicit_struct_type & 1U) == 0) {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_20->super_IVariant).self);
        (*(this->super_Compiler)._vptr_Compiler[6])(__return_storage_ptr__,this,(ulong)uVar2,1);
      }
      else {
        uVar2 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(pSStack_20->super_IVariant).self);
        ts_1_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        (*(this->super_Compiler)._vptr_Compiler[6])(local_f8,this,(ulong)uVar2);
        join<char_const(&)[8],std::__cxx11::string>
                  (__return_storage_ptr__,(spirv_cross *)0x56c4b2,(char (*) [8])local_f8,ts_1_00);
        ::std::__cxx11::string::~string(local_f8);
      }
      break;
    case Image:
    case SampledImage:
      (*(this->super_Compiler)._vptr_Compiler[0x17])
                (__return_storage_ptr__,this,pSStack_20,(ulong)parent._4_4_,0);
      break;
    case Sampler:
      sVar4 = ::std::
              unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              ::count(&(this->super_Compiler).comparison_ids,(key_type *)((long)&parent + 4));
      pcVar5 = "sampler";
      if (sVar4 != 0) {
        pcVar5 = "samplerShadow";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_f9);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_f9);
      break;
    case AccelerationStructure:
      pcVar5 = "accelerationStructureNV";
      if ((this->ray_tracing_is_khr & 1U) != 0) {
        pcVar5 = "accelerationStructureEXT";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,&local_fa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fa);
      break;
    case RayQuery:
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"rayQueryEXT",&local_fb);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_fb);
    }
  }
  else {
    _array_stride = Compiler::get_pointee_type(&this->super_Compiler,pSStack_20);
    local_31 = 0;
    ts_1 = (char (*) [2])0x0;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(__return_storage_ptr__,this,_array_stride);
    TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
              (&local_3c,&pSStack_20->parent_type);
    local_38 = Compiler::get_decoration(&this->super_Compiler,local_3c,ArrayStride);
    while (bVar1 = Compiler::is_array(&this->super_Compiler,_array_stride), bVar1) {
      pbVar3 = VectorView<bool>::back(&(_array_stride->array_size_literal).super_VectorView<bool>);
      if ((*pbVar3 & 1U) == 0) {
        ts = (char (*) [3])
             VectorView<unsigned_int>::back(&(pSStack_20->array).super_VectorView<unsigned_int>);
        ts_1 = (char (*) [2])0x597e50;
        join<char_const(&)[3],unsigned_int_const&,char_const(&)[2]>
                  (&local_90,(spirv_cross *)0x5757ac,ts,(uint *)0x597e50,in_R8);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        this_00 = (spirv_cross *)
                  VectorView<unsigned_int>::back
                            (&(pSStack_20->array).super_VectorView<unsigned_int>);
        join<unsigned_int_const&,char_const(&)[2]>(&local_70,this_00,(uint *)0x597e50,ts_1);
        ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      ::std::__cxx11::to_string(&local_d0,local_38);
      ::std::operator+(&local_b0,"stride_",&local_d0);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_d0);
      TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)1>
                (&local_d4,&_array_stride->parent_type);
      local_38 = Compiler::get_decoration(&this->super_Compiler,local_d4,ArrayStride);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&_array_stride->parent_type);
      _array_stride = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar2);
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Pointer");
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::type_to_glsl(const SPIRType &type, uint32_t id)
{
	if (is_physical_pointer(type) && !is_physical_pointer_to_buffer_block(type))
	{
		// Need to create a magic type name which compacts the entire type information.
		auto *parent = &get_pointee_type(type);
		string name = type_to_glsl(*parent);

		uint32_t array_stride = get_decoration(type.parent_type, DecorationArrayStride);

		// Resolve all array dimensions in one go since once we lose the pointer type,
		// array information is left to to_array_type_glsl. The base type loses array information.
		while (is_array(*parent))
		{
			if (parent->array_size_literal.back())
				name += join(type.array.back(), "_");
			else
				name += join("id", type.array.back(), "_");

			name += "stride_" + std::to_string(array_stride);

			array_stride = get_decoration(parent->parent_type, DecorationArrayStride);
			parent = &get<SPIRType>(parent->parent_type);
		}

		name += "Pointer";
		return name;
	}

	switch (type.basetype)
	{
	case SPIRType::Struct:
		// Need OpName lookup here to get a "sensible" name for a struct.
		if (backend.explicit_struct_type)
			return join("struct ", to_name(type.self));
		else
			return to_name(type.self);

	case SPIRType::Image:
	case SPIRType::SampledImage:
		return image_type_glsl(type, id);

	case SPIRType::Sampler:
		// The depth field is set by calling code based on the variable ID of the sampler, effectively reintroducing
		// this distinction into the type system.
		return comparison_ids.count(id) ? "samplerShadow" : "sampler";

	case SPIRType::AccelerationStructure:
		return ray_tracing_is_khr ? "accelerationStructureEXT" : "accelerationStructureNV";

	case SPIRType::RayQuery:
		return "rayQueryEXT";

	case SPIRType::Void:
		return "void";

	default:
		break;
	}

	if (type.basetype == SPIRType::UInt && is_legacy())
	{
		if (options.es)
			// HACK: spirv-cross changes bools into uints and generates code which compares them to
			// zero. Input code will have already been validated as not to have contained any uints,
			// so any remaining uints must in fact be bools. However, simply returning "bool" here
			// will result in invalid code. Instead, return an int.
			return backend.basic_int_type;
		else
			require_extension_internal("GL_EXT_gpu_shader4");
	}

	if (type.basetype == SPIRType::AtomicCounter)
	{
		if (options.es && options.version < 310)
			SPIRV_CROSS_THROW("At least ESSL 3.10 required for atomic counters.");
		else if (!options.es && options.version < 420)
			require_extension_internal("GL_ARB_shader_atomic_counters");
	}

	const SPIRType *coop_type = &type;
	while (is_pointer(*coop_type) || is_array(*coop_type))
		coop_type = &get<SPIRType>(coop_type->parent_type);

	if (coop_type->op == spv::OpTypeCooperativeMatrixKHR)
	{
		require_extension_internal("GL_KHR_cooperative_matrix");
		if (!options.vulkan_semantics)
			SPIRV_CROSS_THROW("Cooperative matrix only available in Vulkan.");
		// GLSL doesn't support this as spec constant, which makes sense ...
		uint32_t use_type = get<SPIRConstant>(coop_type->cooperative.use_id).scalar();

		const char *use = nullptr;
		switch (use_type)
		{
		case CooperativeMatrixUseMatrixAKHR:
			use = "gl_MatrixUseA";
			break;

		case CooperativeMatrixUseMatrixBKHR:
			use = "gl_MatrixUseB";
			break;

		case CooperativeMatrixUseMatrixAccumulatorKHR:
			use = "gl_MatrixUseAccumulator";
			break;

		default:
			SPIRV_CROSS_THROW("Invalid matrix use.");
		}

		string scope_expr;
		if (const auto *scope = maybe_get<SPIRConstant>(coop_type->cooperative.scope_id))
		{
			if (!scope->specialization)
			{
				require_extension_internal("GL_KHR_memory_scope_semantics");
				if (scope->scalar() == spv::ScopeSubgroup)
					scope_expr = "gl_ScopeSubgroup";
				else if (scope->scalar() == spv::ScopeWorkgroup)
					scope_expr = "gl_ScopeWorkgroup";
				else
					SPIRV_CROSS_THROW("Invalid scope for cooperative matrix.");
			}
		}

		if (scope_expr.empty())
			scope_expr = to_expression(coop_type->cooperative.scope_id);

		return join("coopmat<", type_to_glsl(get<SPIRType>(coop_type->parent_type)), ", ",
		            scope_expr, ", ",
		            to_expression(coop_type->cooperative.rows_id), ", ",
		            to_expression(coop_type->cooperative.columns_id), ", ", use, ">");
	}

	if (type.vecsize == 1 && type.columns == 1) // Scalar builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return "bool";
		case SPIRType::SByte:
			return backend.basic_int8_type;
		case SPIRType::UByte:
			return backend.basic_uint8_type;
		case SPIRType::Short:
			return backend.basic_int16_type;
		case SPIRType::UShort:
			return backend.basic_uint16_type;
		case SPIRType::Int:
			return backend.basic_int_type;
		case SPIRType::UInt:
			return backend.basic_uint_type;
		case SPIRType::AtomicCounter:
			return "atomic_uint";
		case SPIRType::Half:
			return "float16_t";
		case SPIRType::Float:
			return "float";
		case SPIRType::Double:
			return "double";
		case SPIRType::Int64:
			return "int64_t";
		case SPIRType::UInt64:
			return "uint64_t";
		default:
			return "???";
		}
	}
	else if (type.vecsize > 1 && type.columns == 1) // Vector builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bvec", type.vecsize);
		case SPIRType::SByte:
			return join("i8vec", type.vecsize);
		case SPIRType::UByte:
			return join("u8vec", type.vecsize);
		case SPIRType::Short:
			return join("i16vec", type.vecsize);
		case SPIRType::UShort:
			return join("u16vec", type.vecsize);
		case SPIRType::Int:
			return join("ivec", type.vecsize);
		case SPIRType::UInt:
			return join("uvec", type.vecsize);
		case SPIRType::Half:
			return join("f16vec", type.vecsize);
		case SPIRType::Float:
			return join("vec", type.vecsize);
		case SPIRType::Double:
			return join("dvec", type.vecsize);
		case SPIRType::Int64:
			return join("i64vec", type.vecsize);
		case SPIRType::UInt64:
			return join("u64vec", type.vecsize);
		default:
			return "???";
		}
	}
	else if (type.vecsize == type.columns) // Simple Matrix builtin
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
	else
	{
		switch (type.basetype)
		{
		case SPIRType::Boolean:
			return join("bmat", type.columns, "x", type.vecsize);
		case SPIRType::Int:
			return join("imat", type.columns, "x", type.vecsize);
		case SPIRType::UInt:
			return join("umat", type.columns, "x", type.vecsize);
		case SPIRType::Half:
			return join("f16mat", type.columns, "x", type.vecsize);
		case SPIRType::Float:
			return join("mat", type.columns, "x", type.vecsize);
		case SPIRType::Double:
			return join("dmat", type.columns, "x", type.vecsize);
		// Matrix types not supported for int64/uint64.
		default:
			return "???";
		}
	}
}